

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

void __thiscall
icu_63::NFRuleSet::NFRuleSet
          (NFRuleSet *this,RuleBasedNumberFormat *_owner,UnicodeString *descriptions,int32_t index,
          UErrorCode *status)

{
  UnicodeString *this_00;
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t i;
  int32_t iVar4;
  long lVar5;
  __off_t __length;
  int iVar6;
  UnicodeString *this_01;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  this_00 = &this->name;
  (this->name).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4bf0;
  (this->name).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->rules).fStuff = (NFRule **)0x0;
  (this->rules).fCount = 0;
  (this->rules).fCapacity = 0;
  this->owner = _owner;
  NFRuleList::NFRuleList(&this->fractionRules,10);
  this->fIsFractionRuleSet = '\0';
  this->fIsPublic = '\0';
  this->fIsParseable = '\x01';
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    this->nonNumericalRules[lVar5] = (NFRule *)0x0;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = descriptions[index].fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = descriptions[index].fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (iVar6 == 0) {
      *status = U_PARSE_ERROR;
    }
    else {
      this_01 = descriptions + index;
      cVar3 = UnicodeString::doCharAt(this_01,0);
      if (cVar3 == L'%') {
        iVar4 = UnicodeString::indexOf(this_01,L':');
        if (iVar4 == -1) {
          *status = U_PARSE_ERROR;
        }
        else {
          UnicodeString::setTo(this_00,this_01,0,iVar4);
          do {
            sVar1 = (this_01->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar6 = (this_01->fUnion).fFields.fLength;
            }
            else {
              iVar6 = (int)sVar1 >> 5;
            }
            if (iVar6 <= iVar4) break;
            iVar4 = iVar4 + 1;
            cVar3 = UnicodeString::doCharAt(this_01,iVar4);
            UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
          } while (UVar2 != '\0');
          UnicodeString::remove(this_01,(char *)0x0);
        }
      }
      else {
        local_98.p_ = L"%default";
        UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
        UnicodeString::setTo(this_00,&local_70);
        UnicodeString::~UnicodeString(&local_70);
        local_80 = local_98.p_;
      }
      sVar1 = (this_01->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this_01->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      if (iVar6 == 0) {
        *status = U_PARSE_ERROR;
      }
      iVar4 = UnicodeString::indexOf(this_00,L"%%",2,0);
      this->fIsPublic = iVar4 != 0;
      local_a0.p_ = (char16_t *)gNoparse;
      UVar2 = UnicodeString::endsWith(this_00,&local_a0,8);
      local_90 = local_a0.p_;
      if (UVar2 != '\0') {
        this->fIsParseable = '\0';
        sVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (this->name).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        UnicodeString::truncate(this_00,(char *)(ulong)(iVar6 - 8),__length);
      }
    }
  }
  return;
}

Assistant:

NFRuleSet::NFRuleSet(RuleBasedNumberFormat *_owner, UnicodeString* descriptions, int32_t index, UErrorCode& status)
  : name()
  , rules(0)
  , owner(_owner)
  , fractionRules()
  , fIsFractionRuleSet(FALSE)
  , fIsPublic(FALSE)
  , fIsParseable(TRUE)
{
    for (int32_t i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        nonNumericalRules[i] = NULL;
    }

    if (U_FAILURE(status)) {
        return;
    }

    UnicodeString& description = descriptions[index]; // !!! make sure index is valid

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
        return;
    }

    // if the description begins with a rule set name (the rule set
    // name can be omitted in formatter descriptions that consist
    // of only one rule set), copy it out into our "name" member
    // and delete it from the description
    if (description.charAt(0) == gPercent) {
        int32_t pos = description.indexOf(gColon);
        if (pos == -1) {
            // throw new IllegalArgumentException("Rule set name doesn't end in colon");
            status = U_PARSE_ERROR;
        } else {
            name.setTo(description, 0, pos);
            while (pos < description.length() && PatternProps::isWhiteSpace(description.charAt(++pos))) {
            }
            description.remove(0, pos);
        }
    } else {
        name.setTo(UNICODE_STRING_SIMPLE("%default"));
    }

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
    }

    fIsPublic = name.indexOf(gPercentPercent, 2, 0) != 0;

    if ( name.endsWith(gNoparse,8) ) {
        fIsParseable = FALSE;
        name.truncate(name.length()-8); // remove the @noparse from the name
    }

    // all of the other members of NFRuleSet are initialized
    // by parseRules()
}